

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_NearestNeighbors_2eproto::TableStruct::InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O2/mlmodel/format/NearestNeighbors.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  protobuf_DataStructures_2eproto::InitDefaults();
  protobuf_Parameters_2eproto::InitDefaults();
  KNearestNeighborsClassifier::KNearestNeighborsClassifier
            ((KNearestNeighborsClassifier *)&_KNearestNeighborsClassifier_default_instance_);
  DAT_003a4220 = 1;
  NearestNeighborsIndex::NearestNeighborsIndex
            ((NearestNeighborsIndex *)&_NearestNeighborsIndex_default_instance_);
  DAT_003a42a8 = 1;
  UniformWeighting::UniformWeighting((UniformWeighting *)&_UniformWeighting_default_instance_);
  DAT_003a42e0 = 1;
  InverseDistanceWeighting::InverseDistanceWeighting
            ((InverseDistanceWeighting *)&_InverseDistanceWeighting_default_instance_);
  DAT_003a4300 = 1;
  LinearIndex::LinearIndex((LinearIndex *)&_LinearIndex_default_instance_);
  DAT_003a4320 = 1;
  SingleKdTreeIndex::SingleKdTreeIndex((SingleKdTreeIndex *)&_SingleKdTreeIndex_default_instance_);
  DAT_003a4340 = 1;
  SquaredEuclideanDistance::SquaredEuclideanDistance
            ((SquaredEuclideanDistance *)&_SquaredEuclideanDistance_default_instance_);
  DAT_003a4360 = 1;
  DAT_003a41e8 = &_NearestNeighborsIndex_default_instance_;
  DAT_003a41f0 = &_Int64Parameter_default_instance_;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::CoreML::Specification::protobuf_DataStructures_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_Parameters_2eproto::InitDefaults();
  _KNearestNeighborsClassifier_default_instance_.DefaultConstruct();
  _NearestNeighborsIndex_default_instance_.DefaultConstruct();
  _UniformWeighting_default_instance_.DefaultConstruct();
  _InverseDistanceWeighting_default_instance_.DefaultConstruct();
  _LinearIndex_default_instance_.DefaultConstruct();
  _SingleKdTreeIndex_default_instance_.DefaultConstruct();
  _SquaredEuclideanDistance_default_instance_.DefaultConstruct();
  _KNearestNeighborsClassifier_default_instance_.get_mutable()->nearestneighborsindex_ = const_cast< ::CoreML::Specification::NearestNeighborsIndex*>(
      ::CoreML::Specification::NearestNeighborsIndex::internal_default_instance());
  _KNearestNeighborsClassifier_default_instance_.get_mutable()->numberofneighbors_ = const_cast< ::CoreML::Specification::Int64Parameter*>(
      ::CoreML::Specification::Int64Parameter::internal_default_instance());
}